

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::AddCuePoint(Segment *this,uint64_t timestamp,uint64_t track)

{
  Cluster *this_00;
  bool bVar1;
  int32_t iVar2;
  CuePoint *this_01;
  uint64_t uVar3;
  CuePoint *local_68;
  CuePoint *cue;
  Cluster *cluster;
  uint64_t track_local;
  uint64_t timestamp_local;
  Segment *this_local;
  
  if (this->cluster_list_size_ < 1) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = this->cluster_list_[this->cluster_list_size_ + -1];
    if (this_00 == (Cluster *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_01 = (CuePoint *)operator_new(0x28,(nothrow_t *)&std::nothrow);
      local_68 = (CuePoint *)0x0;
      if (this_01 != (CuePoint *)0x0) {
        CuePoint::CuePoint(this_01);
        local_68 = this_01;
      }
      if (local_68 == (CuePoint *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = SegmentInfo::timecode_scale(&this->segment_info_);
        CuePoint::set_time(local_68,timestamp / uVar3);
        iVar2 = Cluster::blocks_added(this_00);
        CuePoint::set_block_number(local_68,(long)iVar2);
        uVar3 = Cluster::position_for_cues(this_00);
        CuePoint::set_cluster_pos(local_68,uVar3);
        CuePoint::set_track(local_68,track);
        bVar1 = Cues::AddCue(&this->cues_,local_68);
        if (bVar1) {
          this->new_cuepoint_ = false;
          this_local._7_1_ = true;
        }
        else {
          if (local_68 != (CuePoint *)0x0) {
            CuePoint::~CuePoint(local_68);
            operator_delete(local_68);
          }
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::AddCuePoint(uint64_t timestamp, uint64_t track) {
  if (cluster_list_size_ < 1)
    return false;

  const Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  CuePoint* const cue = new (std::nothrow) CuePoint();  // NOLINT
  if (!cue)
    return false;

  cue->set_time(timestamp / segment_info_.timecode_scale());
  cue->set_block_number(cluster->blocks_added());
  cue->set_cluster_pos(cluster->position_for_cues());
  cue->set_track(track);
  if (!cues_.AddCue(cue)) {
    delete cue;
    return false;
  }

  new_cuepoint_ = false;
  return true;
}